

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

Metric * __thiscall xLearn::Solver::create_metric(Solver *this)

{
  ObjectCreatorRegistry_xLearn_metric_registry *this_00;
  Metric *pMVar1;
  allocator local_31;
  string local_30;
  
  this_00 = GetRegistry_xLearn_metric_registry();
  std::__cxx11::string::string
            ((string *)&local_30,(this->hyper_param_).metric._M_dataplus._M_p,&local_31);
  pMVar1 = ObjectCreatorRegistry_xLearn_metric_registry::CreateObject(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pMVar1;
}

Assistant:

Metric* Solver::create_metric() {
  Metric* metric;
  metric = CREATE_METRIC(hyper_param_.metric.c_str());
  // Note that here we do not cheack metric == nullptr
  // this is because we can set metric to "none", which 
  // means that we don't print any metric info.
  return metric;
}